

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

pair<llvm::DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>,_bool>
           *__return_storage_ptr__,
          DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
          *this,CancellationDelegate **Key,DenseSetEmpty *Args)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *in_RAX;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *ConstFoundBucket;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *local_28;
  
  local_28 = in_RAX;
  bVar3 = LookupBucketFor<llbuild::core::CancellationDelegate*>(this,Key,&local_28);
  if (!bVar3) {
    local_28 = InsertIntoBucketImpl<llbuild::core::CancellationDelegate*>(this,Key,Key,local_28);
    local_28->key = *Key;
  }
  uVar1 = *(uint *)(this + 0x10);
  lVar2 = *(long *)this;
  (__return_storage_ptr__->first).Ptr = local_28;
  (__return_storage_ptr__->first).End = (pointer)((ulong)uVar1 * 8 + lVar2);
  __return_storage_ptr__->second = !bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const KeyT &Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket = InsertIntoBucket(TheBucket, Key, std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }